

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

void TR_Exp(ast *node,C_OP *place)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  ast *a;
  ast *paVar4;
  IrSim *this;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  attr *paVar7;
  const_iterator cVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  int i;
  _Alloc_hider _Var10;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  int local_190;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  undefined1 local_178 [24];
  int local_160;
  undefined1 local_158 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_140;
  undefined1 local_128 [8];
  _Alloc_hider local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [2];
  _Alloc_hider local_e8;
  char local_d8 [32];
  _Alloc_hider local_b8;
  char local_a8 [24];
  Operand local_90;
  Operand local_60;
  
  while( true ) {
    a = child(node,2);
    paVar4 = child(node,1);
    if (a == (ast *)0x0) {
      if (paVar4->type == 0x102) {
        std::__cxx11::string::string((string *)local_158,paVar4->lex,(allocator *)local_188);
        local_1b8._0_4_ = 2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_158 + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._0_8_ == paVar9) {
          local_1a0._8_8_ = aStack_140._M_allocated_capacity;
          local_1b0._M_p = (pointer)&local_1a0;
        }
        else {
          local_1b0._M_p = (pointer)local_158._0_8_;
        }
        local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._8_8_;
        local_158._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_158[0x10] = '\0';
        local_190 = -1;
        local_158._0_8_ = paVar9;
        IrSim::icUnaryOp((InterCode *)local_128,&irSim,5,place,(C_OP *)local_1b8);
        IrSim::commitIc(&irSim,(C_IC *)local_128);
        if (local_b8._M_p != local_a8) {
          operator_delete(local_b8._M_p);
        }
        if (local_e8._M_p != local_d8) {
          operator_delete(local_e8._M_p);
        }
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT26(local_118._M_allocated_capacity._6_2_,
                             CONCAT15(local_118._M_local_buf[5],
                                      CONCAT14(local_118._M_local_buf[4],
                                               local_118._M_allocated_capacity._0_4_)));
        if (paVar2 != local_108) {
          operator_delete(paVar2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_p != &local_1a0) {
          operator_delete(local_1b0._M_p);
        }
        _Var10._M_p = (pointer)local_158._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._0_8_ == paVar9) {
          return;
        }
        goto LAB_0010bc59;
      }
      if (paVar4->type != 0x11c) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                      ,0x228,"void TR_Exp(ast *, C_OP &)");
      }
      paVar7 = findvar(paVar4->lex);
      if (paVar7->kind != 1) {
        if (paVar7->kind != 0) {
          return;
        }
        std::__cxx11::string::string((string *)local_188,paVar4->lex,(allocator *)&local_90);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&basics_abi_cxx11_,(key_type *)local_188);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_158 + 0x10);
        pcVar1 = (pmVar5->_M_dataplus)._M_p;
        local_158._0_8_ = paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_158,pcVar1,pcVar1 + pmVar5->_M_string_length);
        local_1b8._0_4_ = 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._0_8_ == paVar9) {
          local_1a0._8_8_ = aStack_140._M_allocated_capacity;
          local_1b0._M_p = (pointer)&local_1a0;
        }
        else {
          local_1b0._M_p = (pointer)local_158._0_8_;
        }
        local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._8_8_;
        local_158._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_158[0x10] = '\0';
        local_190 = -1;
        local_158._0_8_ = paVar9;
        IrSim::icUnaryOp((InterCode *)local_128,&irSim,5,place,(C_OP *)local_1b8);
        IrSim::commitIc(&irSim,(C_IC *)local_128);
        if (local_b8._M_p != local_a8) {
          operator_delete(local_b8._M_p);
        }
        if (local_e8._M_p != local_d8) {
          operator_delete(local_e8._M_p);
        }
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT26(local_118._M_allocated_capacity._6_2_,
                             CONCAT15(local_118._M_local_buf[5],
                                      CONCAT14(local_118._M_local_buf[4],
                                               local_118._M_allocated_capacity._0_4_)));
        if (paVar2 != local_108) {
          operator_delete(paVar2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_p != &local_1a0) {
          operator_delete(local_1b0._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._0_8_ != paVar9) {
          operator_delete((void *)local_158._0_8_);
        }
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_178;
        goto LAB_0010bc50;
      }
      std::__cxx11::string::string((string *)local_128,paVar4->lex,(allocator *)local_1b8);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
               ::operator[](&arrays_abi_cxx11_,(key_type *)local_128);
      pcVar1 = (pmVar6->newName)._M_dataplus._M_p;
      local_158._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_158 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_158,pcVar1,pcVar1 + (pmVar6->newName)._M_string_length);
      if (local_128 != (undefined1  [8])&local_118) {
        operator_delete((void *)local_128);
      }
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&irSim.argSet._M_t,(key_type *)local_158);
      if ((_Rb_tree_header *)cVar8._M_node == &irSim.argSet._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::string((string *)&local_90,paVar4->lex,(allocator *)&local_60);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
                 ::operator[](&arrays_abi_cxx11_,(key_type *)&local_90);
        pcVar1 = (pmVar6->newName)._M_dataplus._M_p;
        local_188 = (undefined1  [8])local_178;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_188,pcVar1,pcVar1 + (pmVar6->newName)._M_string_length);
        local_1b0._M_p = (pointer)&local_1a0;
        local_1b8._0_4_ = 1;
        if (local_188 == (undefined1  [8])local_178) {
          local_1a0._8_8_ = local_178._8_8_;
        }
        else {
          local_1b0._M_p = (pointer)local_188;
        }
        local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_p;
        local_180._M_p = (pointer)0x0;
        local_178[0] = '\0';
        local_190 = -1;
        local_188 = (undefined1  [8])local_178;
        IrSim::icUnaryOp((InterCode *)local_128,&irSim,6,place,(C_OP *)local_1b8);
        IrSim::commitIc(&irSim,(C_IC *)local_128);
      }
      else {
        std::__cxx11::string::string((string *)&local_90,paVar4->lex,(allocator *)&local_60);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
                 ::operator[](&arrays_abi_cxx11_,(key_type *)&local_90);
        pcVar1 = (pmVar6->newName)._M_dataplus._M_p;
        local_188 = (undefined1  [8])local_178;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_188,pcVar1,pcVar1 + (pmVar6->newName)._M_string_length);
        local_1b0._M_p = (pointer)&local_1a0;
        local_1b8._0_4_ = 1;
        if (local_188 == (undefined1  [8])local_178) {
          local_1a0._8_8_ = local_178._8_8_;
        }
        else {
          local_1b0._M_p = (pointer)local_188;
        }
        local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_p;
        local_180._M_p = (pointer)0x0;
        local_178[0] = '\0';
        local_190 = -1;
        local_188 = (undefined1  [8])local_178;
        IrSim::icUnaryOp((InterCode *)local_128,&irSim,5,place,(C_OP *)local_1b8);
        IrSim::commitIc(&irSim,(C_IC *)local_128);
      }
      if (local_b8._M_p != local_a8) {
        operator_delete(local_b8._M_p);
      }
      if (local_e8._M_p != local_d8) {
        operator_delete(local_e8._M_p);
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT26(local_118._M_allocated_capacity._6_2_,
                           CONCAT15(local_118._M_local_buf[5],
                                    CONCAT14(local_118._M_local_buf[4],
                                             local_118._M_allocated_capacity._0_4_)));
      if (paVar9 != local_108) {
        operator_delete(paVar9);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_p != &local_1a0) {
        operator_delete(local_1b0._M_p);
      }
      if (local_188 != (undefined1  [8])local_178) {
        operator_delete((void *)local_188);
      }
      if ((pointer)local_90._0_8_ != (pointer)((long)&local_90 + 0x10U)) {
        operator_delete((void *)local_90._0_8_);
      }
      std::__cxx11::string::string((string *)local_128,paVar4->lex,(allocator *)local_1b8);
      std::__cxx11::string::_M_assign((string *)&irSim.curArray);
      if (local_128 != (undefined1  [8])&local_118) {
        operator_delete((void *)local_128);
      }
      _Var10._M_p = (pointer)local_158._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_158 + 0x10)) {
        return;
      }
      goto LAB_0010bc59;
    }
    iVar3 = a->type;
    if (iVar3 == 0x112) break;
    irSim.curDim = -1;
    if (iVar3 != -0x26fd) {
      if (iVar3 == 0x106) {
        TR_ASSIGNOP(a,place);
        return;
      }
      if (iVar3 != 0x110) {
        paVar4 = a;
        if (iVar3 == 0x10e) {
          std::operator<<((ostream *)&std::cerr,"Structure not implemented!\n");
          exit(1);
        }
        goto LAB_0010b6c3;
      }
      paVar4 = sibling(a,-1);
      paVar7 = findfunc(paVar4->lex);
      paVar4 = sibling(a,1);
      if (paVar4->type == 0x111) {
        local_118._M_allocated_capacity._0_4_ = 0x64616572;
        local_120._M_p = (char *)0x4;
        local_118._M_local_buf[4] = '\0';
        local_128 = (undefined1  [8])&local_118;
        iVar3 = std::__cxx11::string::compare(local_128);
        if (local_128 != (undefined1  [8])&local_118) {
          operator_delete((void *)local_128);
        }
        if (iVar3 != 0) {
          local_1b8._0_4_ = 1;
          std::__cxx11::string::string
                    ((string *)&local_1b0,((paVar7->field_1).basic)->name,(allocator *)local_188);
          local_190 = -1;
          IrSim::icUnaryOp((InterCode *)local_128,&irSim,0xc,place,(C_OP *)local_1b8);
          IrSim::commitIc(&irSim,(C_IC *)local_128);
          goto LAB_0010bc09;
        }
        IrSim::icNoOp((InterCode *)local_128,&irSim,0x12,place);
        IrSim::commitIc(&irSim,(InterCode *)local_128);
        if (local_b8._M_p != local_a8) {
          operator_delete(local_b8._M_p);
        }
        if (local_e8._M_p != local_d8) {
          operator_delete(local_e8._M_p);
        }
        paVar9 = local_108;
        goto LAB_0010bc50;
      }
      local_118._M_allocated_capacity._0_4_ = 0x74697277;
      local_118._M_local_buf[4] = 'e';
      local_118._M_local_buf[5] = '\0';
      local_120._M_p = (char *)0x5;
      local_128 = (undefined1  [8])&local_118;
      iVar3 = std::__cxx11::string::compare(local_128);
      if (local_128 != (undefined1  [8])&local_118) {
        operator_delete((void *)local_128);
      }
      if (iVar3 == 0) {
        paVar4 = child(paVar4,1);
        TR_Args((Operand *)local_1b8,paVar4,false);
        IrSim::icNoOp((InterCode *)local_128,&irSim,0x13,(C_OP *)local_1b8);
        IrSim::commitIc(&irSim,(C_IC *)local_128);
        goto LAB_0010bc09;
      }
      paVar4 = child(paVar4,1);
      TR_Args((Operand *)local_158,paVar4,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._8_8_ != &aStack_140) {
        operator_delete((void *)local_158._8_8_);
      }
      local_1b8._0_4_ = place->kind;
      pcVar1 = (place->value)._M_dataplus._M_p;
      local_1b0._M_p = (pointer)&local_1a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar1,pcVar1 + (place->value)._M_string_length);
      local_190 = place->active;
      if (place->kind == 0) {
        IrSim::newTmpVar((Operand *)local_128,&irSim);
        local_1b8._0_4_ = local_128._0_4_;
        std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_120);
        local_190 = local_108[0]._8_4_;
        if (local_120._M_p != local_118._M_local_buf + 8) {
          operator_delete(local_120._M_p);
        }
      }
      local_188._0_4_ = 1;
      std::__cxx11::string::string
                ((string *)&local_180,((paVar7->field_1).basic)->name,(allocator *)&local_90);
      local_160 = -1;
      IrSim::icUnaryOp((InterCode *)local_128,&irSim,0xc,(C_OP *)local_1b8,(C_OP *)local_188);
      IrSim::commitIc(&irSim,(C_IC *)local_128);
      if (local_b8._M_p != local_a8) {
        operator_delete(local_b8._M_p);
      }
      if (local_e8._M_p != local_d8) {
        operator_delete(local_e8._M_p);
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT26(local_118._M_allocated_capacity._6_2_,
                           CONCAT15(local_118._M_local_buf[5],
                                    CONCAT14(local_118._M_local_buf[4],
                                             local_118._M_allocated_capacity._0_4_)));
      if (paVar9 != local_108) {
        operator_delete(paVar9);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_178 + 8)) {
        operator_delete(local_180._M_p);
      }
      _Var10._M_p = local_1b0._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_p == &local_1a0) {
        return;
      }
      goto LAB_0010bc59;
    }
    iVar3 = paVar4->type;
    node = a;
    if (iVar3 != 0x110) {
      if (iVar3 == 0x10f) {
LAB_0010b6c3:
        TR_ARITH(paVar4,place);
        return;
      }
      if (iVar3 != 0x109) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                      ,0x21b,"void TR_Exp(ast *, C_OP &)");
      }
      IrSim::newTmpVar((Operand *)local_1b8,&irSim);
      this = (IrSim *)sibling(paVar4,1);
      TR_Exp((ast *)this,(C_OP *)local_1b8);
      iVar3 = IrSim::ast2ic(this,paVar4);
      IrSim::icBinOp((InterCode *)local_128,&irSim,iVar3,place,&OP_ZERO,(C_OP *)local_1b8);
      IrSim::commitIc(&irSim,(C_IC *)local_128);
LAB_0010bc09:
      if (local_b8._M_p != local_a8) {
        operator_delete(local_b8._M_p);
      }
      if (local_e8._M_p != local_d8) {
        operator_delete(local_e8._M_p);
      }
      paVar9 = local_108;
LAB_0010bc3d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar9->_M_allocated_capacity)[-2] != paVar9) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar9->_M_allocated_capacity)[-2]);
      }
      paVar9 = &local_1a0;
LAB_0010bc50:
      _Var10._M_p = (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               **)(paVar9->_M_local_buf + -0x10);
      if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)(paVar9->_M_local_buf + -0x10) != paVar9) {
LAB_0010bc59:
        operator_delete(_Var10._M_p);
      }
      return;
    }
  }
  IrSim::newTmpVar((Operand *)local_1b8,&irSim);
  IrSim::newTmpVar((Operand *)local_158,&irSim);
  IrSim::newTmpVar((Operand *)local_188,&irSim);
  IrSim::newTmpVar(&local_90,&irSim);
  i = irSim.curDim + 1;
  irSim.curDim = i;
  paVar4 = sibling(a,1);
  TR_Exp(paVar4,(C_OP *)local_158);
  paVar4 = sibling(a,-1);
  TR_Exp(paVar4,(C_OP *)local_1b8);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
           ::operator[](&arrays_abi_cxx11_,&irSim.curArray);
  iVar3 = Array::getSize(pmVar6,i);
  Operand::Operand(&local_60,iVar3);
  IrSim::icBinOp((InterCode *)local_128,&irSim,3,(C_OP *)local_188,(C_OP *)local_158,&local_60);
  IrSim::commitIc(&irSim,(C_IC *)local_128);
  if (local_b8._M_p != local_a8) {
    operator_delete(local_b8._M_p);
  }
  if (local_e8._M_p != local_d8) {
    operator_delete(local_e8._M_p);
  }
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT26(local_118._M_allocated_capacity._6_2_,
                       CONCAT15(local_118._M_local_buf[5],
                                CONCAT14(local_118._M_local_buf[4],
                                         local_118._M_allocated_capacity._0_4_)));
  if (paVar9 != local_108) {
    operator_delete(paVar9);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.value._M_dataplus._M_p != &local_60.value.field_2) {
    operator_delete(local_60.value._M_dataplus._M_p);
  }
  IrSim::icBinOp((InterCode *)local_128,&irSim,1,&local_90,(C_OP *)local_1b8,(C_OP *)local_188);
  IrSim::commitIc(&irSim,(C_IC *)local_128);
  if (local_b8._M_p != local_a8) {
    operator_delete(local_b8._M_p);
  }
  if (local_e8._M_p != local_d8) {
    operator_delete(local_e8._M_p);
  }
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT26(local_118._M_allocated_capacity._6_2_,
                       CONCAT15(local_118._M_local_buf[5],
                                CONCAT14(local_118._M_local_buf[4],
                                         local_118._M_allocated_capacity._0_4_)));
  if (paVar9 != local_108) {
    operator_delete(paVar9);
  }
  if (i == 0) {
    IrSim::icUnaryOp((InterCode *)local_128,&irSim,7,place,&local_90);
    IrSim::commitIc(&irSim,(C_IC *)local_128);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if (local_e8._M_p != local_d8) {
      operator_delete(local_e8._M_p);
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT26(local_118._M_allocated_capacity._6_2_,
                         CONCAT15(local_118._M_local_buf[5],
                                  CONCAT14(local_118._M_local_buf[4],
                                           local_118._M_allocated_capacity._0_4_)));
    if (paVar9 != local_108) {
      operator_delete(paVar9);
    }
    irSim.curDim = -1;
  }
  else {
    IrSim::icUnaryOp((InterCode *)local_128,&irSim,5,place,&local_90);
    IrSim::commitIc(&irSim,(C_IC *)local_128);
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if (local_e8._M_p != local_d8) {
      operator_delete(local_e8._M_p);
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT26(local_118._M_allocated_capacity._6_2_,
                         CONCAT15(local_118._M_local_buf[5],
                                  CONCAT14(local_118._M_local_buf[4],
                                           local_118._M_allocated_capacity._0_4_)));
    if (paVar9 != local_108) {
      operator_delete(paVar9);
    }
  }
  if (local_90.value._M_dataplus._M_p != (pointer)((long)&local_90 + 0x18U)) {
    operator_delete(local_90.value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_178 + 8)) {
    operator_delete(local_180._M_p);
  }
  paVar9 = &aStack_140;
  goto LAB_0010bc3d;
}

Assistant:

static void TR_Exp(ast *node, C_OP &place) {
    ast *c2 = child(node, 2), *c1 = child(node, 1);
    if (c2) {
        if (c2->type != LB) irSim.resetCurDim();
        switch (c2->type) {
            default:            TR_ARITH(c2, place);    break;
            case ASSIGNOP:      TR_ASSIGNOP(c2, place); break;
            case LP:            TR_CallFunc(c2, place); break;
            case Exp:
                switch (c1->type) {
                    case MINUS: TR_MINUS(c1, place);    break;
                    case LP:    TR_Exp(c2, place);      break;
                    case NOT:   TR_ARITH(c1, place);    break;
                    default:    assert(false);
                }
                break;
            case LB:            TR_LB(c2, place);       break;
            case DOT: /* TODO: Struct */
                IMP_ME("Structure");
                break;
        }
    }
    else {
        switch (c1->type) {
            case ID:  TR_ID(c1, place);  break;
            case INT: TR_INT(c1, place); break;
            default:  assert(false);
        }
    }
}